

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::cleanAfterTest
          (TextureCubeMapArrayStencilAttachments *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x78))(0x8ca9,0);
  (**(code **)(lVar2 + 0x78))(0x8ca8,0);
  (**(code **)(lVar2 + 0xb8))(0x9009,0);
  (**(code **)(lVar2 + 0x1680))(0);
  if (this->m_program_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_program_id = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fragment_shader_id = 0;
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_geometry_shader_id = 0;
  }
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vertex_shader_id = 0;
  }
  if (this->m_texture_cube_array_color_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_cube_array_color_id);
    this->m_texture_cube_array_color_id = 0;
  }
  if (this->m_texture_cube_array_stencil_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_texture_cube_array_stencil_id);
    this->m_texture_cube_array_stencil_id = 0;
  }
  if (this->m_result_data != (GLubyte *)0x0) {
    operator_delete__(this->m_result_data);
    this->m_result_data = (GLubyte *)0x0;
  }
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::cleanAfterTest(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);
	gl.useProgram(0);

	if (m_program_id != 0)
	{
		gl.deleteProgram(m_program_id);

		m_program_id = 0;
	}

	if (m_fragment_shader_id != 0)
	{
		gl.deleteShader(m_fragment_shader_id);

		m_fragment_shader_id = 0;
	}

	if (m_geometry_shader_id != 0)
	{
		gl.deleteShader(m_geometry_shader_id);

		m_geometry_shader_id = 0;
	}

	if (m_vertex_shader_id != 0)
	{
		gl.deleteShader(m_vertex_shader_id);

		m_vertex_shader_id = 0;
	}

	if (m_texture_cube_array_color_id != 0)
	{
		gl.deleteTextures(1, &m_texture_cube_array_color_id);

		m_texture_cube_array_color_id = 0;
	}

	if (m_texture_cube_array_stencil_id != 0)
	{
		gl.deleteTextures(1, &m_texture_cube_array_stencil_id);

		m_texture_cube_array_stencil_id = 0;
	}

	if (m_result_data != DE_NULL)
	{
		delete[] m_result_data;

		m_result_data = DE_NULL;
	}
}